

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_value.h
# Opt level: O1

bool Potassco::ProgramOptions::FlagAction::store_false(string *v,bool *b)

{
  int iVar1;
  bool bVar2;
  bool temp;
  char *end;
  bool local_19;
  char *local_18;
  
  if (v->_M_string_length == 0) {
    local_19 = true;
    bVar2 = true;
  }
  else {
    bVar2 = false;
    iVar1 = Potassco::xconvert((v->_M_dataplus)._M_p,&local_19,&local_18,0);
    if (iVar1 != 0) {
      bVar2 = *local_18 == '\0';
    }
  }
  if (bVar2 != false) {
    *b = (bool)(local_19 ^ 1);
  }
  return bVar2;
}

Assistant:

static inline bool store_false(const std::string& v, bool& b) {
		bool temp;
		return store_true(v, temp) && ((b = !temp), true);
	}